

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

bool __thiscall
cmListFile::ParseString
          (cmListFile *this,char *str,char *virtual_filename,cmMessenger *messenger,
          cmListFileBacktrace *lfbt)

{
  bool bVar1;
  cmListFileBacktrace local_c8;
  undefined1 local_b8 [8];
  cmListFileParser parser;
  bool parseError;
  cmListFileBacktrace *lfbt_local;
  cmMessenger *messenger_local;
  char *virtual_filename_local;
  char *str_local;
  cmListFile *this_local;
  
  parser._127_1_ = 0;
  cmListFileBacktrace::cmListFileBacktrace(&local_c8,lfbt);
  cmListFileParser::cmListFileParser((cmListFileParser *)local_b8,this,&local_c8,messenger);
  cmListFileBacktrace::~cmListFileBacktrace(&local_c8);
  bVar1 = cmListFileParser::ParseString((cmListFileParser *)local_b8,str,virtual_filename);
  parser._127_1_ = (bVar1 ^ 0xffU) & 1;
  cmListFileParser::~cmListFileParser((cmListFileParser *)local_b8);
  return (bool)((parser._127_1_ ^ 0xff) & 1);
}

Assistant:

bool cmListFile::ParseString(const char* str, const char* virtual_filename,
                             cmMessenger* messenger,
                             const cmListFileBacktrace& lfbt)
{
  bool parseError = false;

  {
    cmListFileParser parser(this, lfbt, messenger);
    parseError = !parser.ParseString(str, virtual_filename);
  }

  return !parseError;
}